

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testMultiPartFileMixingBasic.cpp
# Opt level: O0

void testMultiPartFileMixingBasic(string *tempDir)

{
  int iVar1;
  ostream *poVar2;
  string *tempDir_00;
  exception *e;
  int numThreads;
  int randomReadCount;
  int in_stack_ffffffffffffffe0;
  int in_stack_ffffffffffffffe4;
  
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "Testing the mixed (ScanLine, Tiled, DeepScanLine and DeepTiled) multi-part file"
                          );
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  randomReadCount = (int)((ulong)poVar2 >> 0x20);
  random_reseed(0);
  tempDir_00 = (string *)IlmThread_3_2::ThreadPool::globalThreadPool();
  IlmThread_3_2::ThreadPool::numThreads();
  iVar1 = IlmThread_3_2::ThreadPool::globalThreadPool();
  IlmThread_3_2::ThreadPool::setNumThreads(iVar1);
  anon_unknown.dwarf_16af90::testWriteRead
            (in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0,randomReadCount,tempDir_00);
  anon_unknown.dwarf_16af90::testWriteRead
            (in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0,randomReadCount,tempDir_00);
  anon_unknown.dwarf_16af90::testWriteRead
            (in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0,randomReadCount,tempDir_00);
  anon_unknown.dwarf_16af90::testWriteRead
            (in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0,randomReadCount,tempDir_00);
  iVar1 = IlmThread_3_2::ThreadPool::globalThreadPool();
  IlmThread_3_2::ThreadPool::setNumThreads(iVar1);
  poVar2 = std::operator<<((ostream *)&std::cout,"ok\n");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void
testMultiPartFileMixingBasic (const std::string& tempDir)
{
    try
    {
        cout
            << "Testing the mixed (ScanLine, Tiled, DeepScanLine and DeepTiled)"
               " multi-part file"
            << endl;

        random_reseed (1);

        int numThreads = ThreadPool::globalThreadPool ().numThreads ();
        ThreadPool::globalThreadPool ().setNumThreads (4);

        testWriteRead (1, 1, 50, tempDir);
        testWriteRead (2, 2, 100, tempDir);
        testWriteRead (5, 3, 250, tempDir);
        testWriteRead (50, 4, 2500, tempDir);

        ThreadPool::globalThreadPool ().setNumThreads (numThreads);

        cout << "ok\n" << endl;
    }
    catch (const std::exception& e)
    {
        cerr << "ERROR -- caught exception: " << e.what () << endl;
        assert (false);
    }
}